

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O3

int write_header(FIOBJ o,void *w_)

{
  FIOBJ FVar1;
  fiobj_object_vtable_s *pfVar2;
  uint uVar3;
  char cVar4;
  char cVar5;
  uint uVar6;
  fio_str_info_s name;
  fio_str_info_s str;
  fio_str_info_s local_58;
  fio_str_info_s local_38;
  ulong uVar7;
  
  if (o == 0) {
    return 0;
  }
  FVar1 = fiobj_hash_key_in_loop();
  if (FVar1 != 0) {
    FVar1 = fiobj_hash_key_in_loop();
    *(FIOBJ *)((long)w_ + 8) = FVar1;
  }
  uVar6 = (uint)o & 6;
  uVar7 = (ulong)uVar6;
  cVar5 = (char)o;
  if ((uVar7 != 6 && (o & 1) == 0) && (*(char *)(o & 0xfffffffffffffff8) == ')')) {
    if (*(long *)((&PTR_FIOBJECT_VTABLE_ARRAY_00189c88)[uVar7] + 0x28) == 0) {
      return 0;
    }
    (**(code **)((&PTR_FIOBJECT_VTABLE_ARRAY_00189c88)[uVar7] + 0x28))(o,0,write_header,w_);
    return 0;
  }
  uVar7 = *(ulong *)((long)w_ + 8);
  if (uVar7 == 0) {
LAB_0015164c:
    local_58.data = anon_var_dwarf_20c;
    local_58.len._0_4_ = 4;
    goto LAB_0015165f;
  }
  cVar4 = (char)uVar7;
  if ((uVar7 & 1) == 0) {
    switch((uint)uVar7 & 6) {
    case 0:
      cVar4 = *(char *)(uVar7 & 0xfffffffffffffff8);
LAB_001515e1:
      switch(cVar4) {
      case '\'':
        pfVar2 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        goto switchD_001515d6_caseD_2;
      case ')':
        pfVar2 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        goto switchD_001515d6_caseD_4;
      case '+':
        pfVar2 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar2 = &FIOBJECT_VTABLE_NUMBER;
      }
      break;
    case 2:
switchD_001515d6_caseD_2:
      pfVar2 = &FIOBJECT_VTABLE_STRING;
      break;
    case 4:
switchD_001515d6_caseD_4:
      pfVar2 = &FIOBJECT_VTABLE_HASH;
      break;
    case 6:
      if (cVar4 == '&') {
        local_58.data = anon_var_dwarf_217;
        local_58.len._0_4_ = 5;
      }
      else {
        uVar3 = (uint)uVar7 & 0xff;
        if (uVar3 != 0x16) {
          if (uVar3 == 6) goto LAB_0015164c;
          goto LAB_001515e1;
        }
        local_58.data = anon_var_dwarf_222;
        local_58.len._0_4_ = 4;
      }
LAB_0015165f:
      local_58.capa._0_4_ = 0;
      local_58.capa._4_4_ = 0;
      local_58.len._4_4_ = 0;
      goto LAB_00151663;
    }
    (*pfVar2->to_str)(&local_58,uVar7);
  }
  else {
    fio_ltocstr(&local_58,(long)uVar7 >> 1);
  }
LAB_00151663:
  if ((o & 1) != 0) {
    fio_ltocstr(&local_38,(long)o >> 1);
    goto LAB_001516d7;
  }
  switch(uVar6) {
  case 0:
    cVar5 = *(char *)(o & 0xfffffffffffffff8);
LAB_00151682:
    switch(cVar5) {
    case '\'':
      pfVar2 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      goto switchD_00151677_caseD_2;
    case ')':
      pfVar2 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      goto switchD_00151677_caseD_4;
    case '+':
      pfVar2 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar2 = &FIOBJECT_VTABLE_NUMBER;
    }
    break;
  case 2:
switchD_00151677_caseD_2:
    pfVar2 = &FIOBJECT_VTABLE_STRING;
    break;
  case 4:
switchD_00151677_caseD_4:
    pfVar2 = &FIOBJECT_VTABLE_HASH;
    break;
  case 6:
    if (cVar5 == '&') {
      local_38.data = anon_var_dwarf_217;
      local_38.len._0_4_ = 5;
    }
    else {
      uVar6 = (uint)o & 0xff;
      if (uVar6 == 0x16) {
        local_38.data = anon_var_dwarf_222;
        local_38.len._0_4_ = 4;
      }
      else {
        if (uVar6 != 6) goto LAB_00151682;
        local_38.data = anon_var_dwarf_20c;
        local_38.len._0_4_ = 4;
      }
    }
    local_38.len._4_4_ = 0;
    local_38.capa._4_4_ = 0;
    local_38.capa._0_4_ = 0;
    goto LAB_001516d7;
  }
  (*pfVar2->to_str)(&local_38,o);
LAB_001516d7:
  if (local_38.data != (char *)0x0) {
    fiobj_str_write(*w_,local_58.data,CONCAT44(local_58.len._4_4_,(undefined4)local_58.len));
    fiobj_str_write(*w_,":",1);
    fiobj_str_write(*w_,local_38.data,CONCAT44(local_38.len._4_4_,(undefined4)local_38.len));
    fiobj_str_write(*w_,"\r\n",2);
  }
  return 0;
}

Assistant:

static int write_header(FIOBJ o, void *w_) {
  struct header_writer_s *w = w_;
  if (!o)
    return 0;
  if (fiobj_hash_key_in_loop()) {
    w->name = fiobj_hash_key_in_loop();
  }
  if (FIOBJ_TYPE_IS(o, FIOBJ_T_ARRAY)) {
    fiobj_each1(o, 0, write_header, w);
    return 0;
  }
  fio_str_info_s name = fiobj_obj2cstr(w->name);
  fio_str_info_s str = fiobj_obj2cstr(o);
  if (!str.data)
    return 0;
  // fiobj_str_capa_assert(w->dest,
  //                       fiobj_obj2cstr(w->dest).len + name.len + str.len +
  //                       5);
  fiobj_str_write(w->dest, name.data, name.len);
  fiobj_str_write(w->dest, ":", 1);
  fiobj_str_write(w->dest, str.data, str.len);
  fiobj_str_write(w->dest, "\r\n", 2);
  return 0;
}